

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

long duckdb::BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,long,long,long>
               (bool fun,long left,long right,ValidityMask *mask,idx_t idx)

{
  long lVar1;
  undefined8 uVar2;
  long in_RDX;
  long in_RSI;
  OutOfRangeException *in_R8;
  idx_t in_stack_ffffffffffffff78;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff80;
  allocator local_51;
  string local_50 [8];
  long in_stack_ffffffffffffffb8;
  long in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  long local_8;
  
  lVar1 = NumericLimits<long>::Minimum();
  if ((in_RSI == lVar1) && (in_RDX == -1)) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_50,"Overflow in division of %d / %d",&local_51);
    OutOfRangeException::OutOfRangeException<long,long>
              (in_R8,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  if (in_RDX == 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_8 = in_RSI;
  }
  else {
    local_8 = DivideOperator::Operation<long,long,long>(in_RSI,in_RDX);
  }
  return local_8;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		if (left == NumericLimits<LEFT_TYPE>::Minimum() && right == -1) {
			throw OutOfRangeException("Overflow in division of %d / %d", left, right);
		} else if (right == 0) {
			mask.SetInvalid(idx);
			return left;
		} else {
			return OP::template Operation<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(left, right);
		}
	}